

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

void __thiscall deqp::egl::MakeCurrentPerfCase::chooseConfig(MakeCurrentPerfCase *this)

{
  SurfaceType SVar1;
  deUint32 err;
  Library *pLVar2;
  NotSupportedError *this_00;
  allocator<char> local_6d;
  EGLint configCount;
  string local_68;
  EGLint attribList [5];
  
  SVar1 = (this->m_spec).surfaceTypes;
  attribList[1] =
       (SVar1 & SURFACETYPE_PBUFFER | SVar1 >> 1 & SURFACETYPE_WINDOW) +
       (SVar1 & SURFACETYPE_WINDOW) * 2;
  attribList[0] = 0x3033;
  attribList[2] = 0x3040;
  attribList[3] = 4;
  attribList[4] = 0x3038;
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  configCount = 0;
  (*pLVar2->_vptr_Library[2])(pLVar2,this->m_display,attribList,&this->m_config,1,&configCount);
  err = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  eglu::checkError(err,"chooseConfig(m_display, attribList, &m_config, 1, &configCount)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                   ,0xcf);
  if (0 < configCount) {
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"No compatible configs found",&local_6d);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_68);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MakeCurrentPerfCase::chooseConfig (void)
{
	const EGLint	surfaceBits	= ((m_spec.surfaceTypes & SURFACETYPE_WINDOW) != 0 ? EGL_WINDOW_BIT : 0)
									| ((m_spec.surfaceTypes & SURFACETYPE_PIXMAP) != 0 ? EGL_PIXMAP_BIT : 0)
									| ((m_spec.surfaceTypes & SURFACETYPE_PBUFFER) != 0 ? EGL_PBUFFER_BIT : 0);

	const EGLint	attribList[] = {
		EGL_SURFACE_TYPE,		surfaceBits,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};

	const Library&	egl			= m_eglTestCtx.getLibrary();
	EGLint			configCount = 0;

	EGLU_CHECK_CALL(egl, chooseConfig(m_display, attribList, &m_config, 1, &configCount));

	if (configCount <= 0)
		throw tcu::NotSupportedError("No compatible configs found");
}